

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Progress.cpp
# Opt level: O0

void __thiscall Progress::renderStyleMono(Progress *this)

{
  _Setfill<char> _Var1;
  int iVar2;
  _Setw _Var3;
  long lVar4;
  string *this_00;
  ostream *poVar5;
  int iVar6;
  double dVar7;
  int local_130;
  int local_120;
  int local_110;
  allocator<char> local_d5;
  int visible;
  undefined1 local_d0 [4];
  int bar;
  string local_b0;
  string local_90 [8];
  string estimate_time;
  string local_60;
  string local_40 [8];
  string elapsed_time;
  time_t now;
  double fraction;
  Progress *this_local;
  
  dVar7 = ((double)(this->current - this->minimum) * 1.0) / (double)(this->maximum - this->minimum);
  elapsed_time.field_2._8_8_ = time((time_t *)0x0);
  std::__cxx11::string::string(local_40);
  if (((this->elapsed & 1U) != 0) && (this->start != 0)) {
    formatTime_abi_cxx11_(&local_60,this,elapsed_time.field_2._8_8_ - this->start);
    std::__cxx11::string::operator=(local_40,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::__cxx11::string::string(local_90);
  if (((this->estimate & 1U) != 0) && (this->start != 0)) {
    if (dVar7 < 1e-06) {
      formatTime_abi_cxx11_((string *)local_d0,this,0);
      std::__cxx11::string::operator=(local_90,(string *)local_d0);
      std::__cxx11::string::~string((string *)local_d0);
    }
    else {
      formatTime_abi_cxx11_
                (&local_b0,this,
                 (long)(int)(((double)(elapsed_time.field_2._8_8_ - this->start) * (1.0 - dVar7)) /
                            dVar7));
      std::__cxx11::string::operator=(local_90,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  iVar2 = this->width;
  lVar4 = std::__cxx11::string::length();
  if (lVar4 == 0) {
    local_110 = 0;
  }
  else {
    local_110 = std::__cxx11::string::length();
    local_110 = local_110 + 1;
  }
  iVar6 = 0;
  if ((this->percentage & 1U) != 0) {
    iVar6 = 5;
  }
  if ((this->elapsed & 1U) == 0) {
    local_120 = 0;
  }
  else {
    local_120 = std::__cxx11::string::length();
    local_120 = local_120 + 1;
  }
  if ((this->estimate & 1U) == 0) {
    local_130 = 0;
  }
  else {
    local_130 = std::__cxx11::string::length();
    local_130 = local_130 + 1;
  }
  visible = (((iVar2 - local_110) - iVar6) - local_120) - local_130;
  if (0 < visible) {
    iVar2 = (int)(dVar7 * (double)visible);
    lVar4 = std::__cxx11::string::length();
    if (lVar4 != 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)&this->label);
      std::operator<<(poVar5,' ');
    }
    if (0 < iVar2) {
      poVar5 = std::operator<<((ostream *)&std::cout,"\x1b[47m");
      _Var1 = std::setfill<char>(' ');
      poVar5 = std::operator<<(poVar5,_Var1._M_c);
      _Var3 = std::setw(iVar2);
      poVar5 = std::operator<<(poVar5,_Var3);
      std::operator<<(poVar5,' ');
    }
    if (0 < visible - iVar2) {
      poVar5 = std::operator<<((ostream *)&std::cout,"\x1b[40m");
      _Var1 = std::setfill<char>(' ');
      poVar5 = std::operator<<(poVar5,_Var1._M_c);
      _Var3 = std::setw(visible - iVar2);
      poVar5 = std::operator<<(poVar5,_Var3);
      std::operator<<(poVar5,' ');
    }
    std::operator<<((ostream *)&std::cout,"\x1b[0m");
    if ((this->percentage & 1U) != 0) {
      poVar5 = std::operator<<((ostream *)&std::cout," ");
      _Var1 = std::setfill<char>(' ');
      poVar5 = std::operator<<(poVar5,_Var1._M_c);
      _Var3 = std::setw(3);
      poVar5 = std::operator<<(poVar5,_Var3);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)(dVar7 * 100.0));
      std::operator<<(poVar5,"%");
    }
    if (((this->elapsed & 1U) != 0) && (this->start != 0)) {
      poVar5 = std::operator<<((ostream *)&std::cout," ");
      std::operator<<(poVar5,local_40);
    }
    if (((this->estimate & 1U) != 0) && (this->start != 0)) {
      poVar5 = std::operator<<((ostream *)&std::cout," ");
      std::operator<<(poVar5,local_90);
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"\r");
    std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_40);
    return;
  }
  this_00 = (string *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,"The specified width is insufficient.",&local_d5);
  __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void Progress::renderStyleMono ()
{
  // Fraction completed.
  double fraction = (1.0 * (current - minimum)) / (maximum - minimum);

  // Elapsed time.
  time_t now = time (NULL);
  std::string elapsed_time;
  if (elapsed && start != 0)
    elapsed_time = formatTime (now - start);

  // Estimated remaining time.
  std::string estimate_time;
  if (estimate && start != 0)
  {
    if (fraction >= 1e-6)
      estimate_time = formatTime ((time_t) (int) (((now - start) * (1.0 - fraction)) / fraction));
    else
      estimate_time = formatTime (0);
  }

  // Calculate bar width.
  int bar = width
          - (label.length () ? label.length () + 1         : 0)
          - (percentage      ? 5                           : 0)
          - (elapsed         ? elapsed_time.length () + 1  : 0)
          - (estimate        ? estimate_time.length () + 1 : 0);

  if (bar < 1)
    throw std::string ("The specified width is insufficient.");

  int visible = (int) (fraction * bar);

  // Render.
  if (label.length ())
    std::cout << label
              << ' ';

  if (visible > 0)
    std::cout << "\033[47m" // White
              << std::setfill (' ')
              << std::setw (visible)
              << ' ';

  if (bar - visible > 0)
    std::cout << "\033[40m" // Black
              << std::setfill (' ')
              << std::setw (bar - visible)
              << ' ';

  std::cout << "\033[0m";

  if (percentage)
    std::cout << " "
              << std::setfill (' ')
              << std::setw (3)
              << (int) (fraction * 100)
              << "%";

  if (elapsed && start != 0)
    std::cout << " "
              << elapsed_time;

  if (estimate && start != 0)
    std::cout << " "
              << estimate_time;

  std::cout << "\r"
            << std::flush;
}